

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O3

rtaudio_device_info_t *
rtaudio_get_device_info(rtaudio_device_info_t *__return_storage_ptr__,rtaudio_t audio,uint id)

{
  ulong uVar1;
  DeviceInfo info;
  DeviceInfo local_78;
  
  memset(__return_storage_ptr__,0,0x268);
  audio->errtype = 0;
  RtApi::getDeviceInfo(&local_78,audio->audio->rtapi_,id);
  if (audio->errtype == 0) {
    __return_storage_ptr__->id = local_78.ID;
    __return_storage_ptr__->output_channels = local_78.outputChannels;
    __return_storage_ptr__->input_channels = local_78.inputChannels;
    __return_storage_ptr__->duplex_channels = local_78.duplexChannels;
    __return_storage_ptr__->is_default_output = (uint)local_78.isDefaultOutput;
    __return_storage_ptr__->is_default_input = (uint)local_78.isDefaultInput;
    __return_storage_ptr__->native_formats = local_78.nativeFormats;
    __return_storage_ptr__->preferred_sample_rate = local_78.preferredSampleRate;
    strncpy(__return_storage_ptr__->name,local_78.name._M_dataplus._M_p,0x1ff);
    if ((long)local_78.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      uVar1 = 0;
      do {
        if ((uint)uVar1 < 0x10) {
          __return_storage_ptr__->sample_rates[uVar1] =
               local_78.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar1];
        }
        uVar1 = uVar1 + 1;
      } while ((uVar1 & 0xffffffff) <
               (ulong)((long)local_78.sampleRates.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_78.sampleRates.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2));
    }
  }
  if (local_78.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.sampleRates.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

rtaudio_device_info_t rtaudio_get_device_info(rtaudio_t audio, unsigned int id) {
  rtaudio_device_info_t result;
  std::memset(&result, 0, sizeof(result));

  audio->errtype = RTAUDIO_ERROR_NONE;
  RtAudio::DeviceInfo info = audio->audio->getDeviceInfo(id);
  if (audio->errtype != RTAUDIO_ERROR_NONE)
      return result;

  result.id = info.ID;
  result.output_channels = info.outputChannels;
  result.input_channels = info.inputChannels;
  result.duplex_channels = info.duplexChannels;
  result.is_default_output = info.isDefaultOutput;
  result.is_default_input = info.isDefaultInput;
  result.native_formats = info.nativeFormats;
  result.preferred_sample_rate = info.preferredSampleRate;
  strncpy(result.name, info.name.c_str(), sizeof(result.name) - 1);
  for (unsigned int j = 0; j < info.sampleRates.size(); j++) {
    if (j < sizeof(result.sample_rates) / sizeof(result.sample_rates[0])) {
      result.sample_rates[j] = info.sampleRates[j];
    }
  }
  return result;
}